

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast.hpp
# Opt level: O3

longdouble *
chaiscript::boxed_cast<long_double>
          (longdouble *__return_storage_ptr__,Boxed_Value *bv,Type_Conversions_State *t_conversions)

{
  undefined8 *puVar1;
  type_info *ptVar2;
  type_info *ptVar3;
  bool bVar4;
  longdouble *plVar5;
  longdouble *extraout_RAX;
  undefined8 *puVar6;
  undefined1 local_78 [8];
  undefined1 auStack_70 [32];
  _Base_ptr local_50;
  pointer local_48;
  undefined4 local_40;
  
  if (bv != (Boxed_Value *)0x0) {
    local_78 = (undefined1  [8])&long_double::typeinfo;
    auStack_70._0_8_ = &long_double::typeinfo;
    auStack_70._8_4_ = 0x10;
    bVar4 = Type_Info::bare_equal(*(Type_Info **)__return_storage_ptr__,(Type_Info *)local_78);
    if ((!bVar4) &&
       (bVar4 = Type_Conversions::convertable_type<long_double>
                          ((Type_Conversions *)
                           (bv->m_data).
                           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr), bVar4)) {
      bVar4 = Type_Conversions::convertable_type<long_double>
                        ((Type_Conversions *)
                         (bv->m_data).
                         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
      if (!bVar4) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(0x38);
        puVar1 = *(undefined8 **)__return_storage_ptr__;
        auStack_70._8_8_ = puVar1[2];
        ptVar2 = (type_info *)*puVar1;
        ptVar3 = (type_info *)puVar1[1];
        *puVar6 = &PTR__bad_cast_003b0660;
        local_78._0_4_ = SUB84(ptVar2,0);
        local_78._4_4_ = (undefined4)((ulong)ptVar2 >> 0x20);
        auStack_70._0_4_ = SUB84(ptVar3,0);
        auStack_70._4_4_ = (undefined4)((ulong)ptVar3 >> 0x20);
        *(undefined4 *)(puVar6 + 1) = local_78._0_4_;
        *(undefined4 *)((long)puVar6 + 0xc) = local_78._4_4_;
        *(undefined4 *)(puVar6 + 2) = auStack_70._0_4_;
        *(undefined4 *)((long)puVar6 + 0x14) = auStack_70._4_4_;
        puVar6[3] = auStack_70._8_8_;
        puVar6[4] = &long_double::typeinfo;
        puVar6[5] = 0x19;
        puVar6[6] = "Cannot perform boxed_cast";
        local_78 = (undefined1  [8])ptVar2;
        auStack_70._0_8_ = ptVar3;
        __cxa_throw(puVar6,&exception::bad_boxed_cast::typeinfo,std::bad_cast::~bad_cast);
      }
      local_50 = (_Base_ptr)&long_double::typeinfo;
      local_48 = (pointer)&long_double::typeinfo;
      local_40 = 0x10;
      Type_Conversions::boxed_type_conversion
                ((Type_Conversions *)local_78,
                 &((bv->m_data).
                   super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->m_type_info,(Conversion_Saves *)&local_50,
                 (Boxed_Value *)
                 (bv->m_data).
                 super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      plVar5 = (longdouble *)
               detail::verify_type<void>
                         ((Boxed_Value *)local_78,(type_info *)&long_double::typeinfo,
                          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_78 + 0x28))
      ;
      auStack_70._20_10_ = *plVar5;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_70._0_8_ ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return plVar5;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_70._0_8_);
      return extraout_RAX;
    }
  }
  plVar5 = (longdouble *)
           detail::verify_type<void>
                     (*(Boxed_Value **)__return_storage_ptr__,(type_info *)&long_double::typeinfo,
                      (*(Boxed_Value **)__return_storage_ptr__)[2].m_data.
                      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi);
  return plVar5;
}

Assistant:

decltype(auto) boxed_cast(const Boxed_Value &bv, const Type_Conversions_State *t_conversions = nullptr) {
    if (!t_conversions || bv.get_type_info().bare_equal(user_type<Type>()) || (t_conversions && !(*t_conversions)->convertable_type<Type>())) {
      try {
        return detail::Cast_Helper<Type>::cast(bv, t_conversions);
      } catch (const chaiscript::detail::exception::bad_any_cast &) {
      }
    }

    if (t_conversions && (*t_conversions)->convertable_type<Type>()) {
      try {
        // We will not catch any bad_boxed_dynamic_cast that is thrown, let the user get it
        // either way, we are not responsible if it doesn't work
        return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_conversion<Type>(t_conversions->saves(), bv), t_conversions));
      } catch (...) {
        try {
          // try going the other way
          return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_down_conversion<Type>(t_conversions->saves(), bv),
                                                  t_conversions));
        } catch (const chaiscript::detail::exception::bad_any_cast &) {
          throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
        }
      }
    } else {
      // If it's not convertable, just throw the error, don't waste the time on the
      // attempted dynamic_cast
      throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
    }
  }